

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

ostream * operator<<(ostream *stream,Variable *obj)

{
  string local_30;
  
  LiteScript::Variable::operator_cast_to_string(&local_30,obj);
  std::operator<<(stream,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const LiteScript::Variable& obj) {
    stream << (std::string)(obj);
    return stream;
}